

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimization.cc
# Opt level: O3

void re2c::minimization(dfa_t *dfa)

{
  pointer ppdVar1;
  pointer ppdVar2;
  size_t sVar3;
  pointer ppdVar4;
  dfa_state_t *pdVar5;
  ulong uVar6;
  mapped_type mVar7;
  size_t *psVar8;
  int iVar9;
  void *pvVar10;
  opt_t *poVar11;
  undefined8 *puVar12;
  void *pvVar13;
  mapped_type *pmVar14;
  void *pvVar15;
  void *pvVar16;
  bool bVar17;
  long lVar18;
  long lVar19;
  size_t i;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  undefined8 uVar25;
  pointer ppdVar26;
  size_t k;
  size_t sVar27;
  ulong uVar28;
  size_type __new_size;
  ulong uVar29;
  unsigned_long uVar30;
  bool bVar31;
  pair<std::_Rb_tree_iterator<std::pair<const_std::pair<re2c::RuleOp_*,_bool>,_unsigned_long>_>,_bool>
  pVar32;
  pair<re2c::RuleOp_*,_bool> key;
  map<std::pair<re2c::RuleOp_*,_bool>,_unsigned_long,_std::less<std::pair<re2c::RuleOp_*,_bool>_>,_std::allocator<std::pair<const_std::pair<re2c::RuleOp_*,_bool>,_unsigned_long>_>_>
  init;
  key_type local_d0;
  ulong local_c0;
  pair<std::pair<re2c::RuleOp_*,_bool>,_unsigned_long> local_b8;
  ulong local_98;
  pointer local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  size_t local_68;
  _Rb_tree<std::pair<re2c::RuleOp_*,_bool>,_std::pair<const_std::pair<re2c::RuleOp_*,_bool>,_unsigned_long>,_std::_Select1st<std::pair<const_std::pair<re2c::RuleOp_*,_bool>,_unsigned_long>_>,_std::less<std::pair<re2c::RuleOp_*,_bool>_>,_std::allocator<std::pair<const_std::pair<re2c::RuleOp_*,_bool>,_unsigned_long>_>_>
  local_60;
  
  ppdVar1 = (dfa->states).
            super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppdVar2 = (dfa->states).
            super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_98 = (long)ppdVar2 - (long)ppdVar1 >> 3;
  local_88 = -(ulong)(local_98 >> 0x3d != 0) | (long)ppdVar2 - (long)ppdVar1;
  pvVar10 = operator_new__(local_88);
  poVar11 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
  if (poVar11->dfa_minimization == DFA_MINIMIZATION_MOORE) {
    ppdVar26 = (dfa->states).
               super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>._M_impl
               .super__Vector_impl_data._M_finish;
    sVar3 = dfa->nchars;
    ppdVar4 = (dfa->states).
              super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar21 = (long)ppdVar26 - (long)ppdVar4;
    uVar20 = (long)uVar21 >> 3;
    if (0x1fffffffffffffff < uVar20) {
      uVar21 = 0xffffffffffffffff;
    }
    pvVar13 = operator_new__(uVar21);
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    if (ppdVar26 != ppdVar4) {
      uVar30 = 0;
      do {
        pdVar5 = (dfa->states).
                 super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar30];
        local_d0.first = pdVar5->rule;
        local_d0.second = pdVar5->ctx;
        local_b8.first._9_4_ = local_d0._9_4_;
        local_b8.first._13_2_ = local_d0._13_2_;
        local_b8.first._15_1_ = local_d0._15_1_;
        local_b8.first.first = local_d0.first;
        local_b8.first.second = local_d0.second;
        local_b8.second = uVar30;
        pVar32 = std::
                 _Rb_tree<std::pair<re2c::RuleOp*,bool>,std::pair<std::pair<re2c::RuleOp*,bool>const,unsigned_long>,std::_Select1st<std::pair<std::pair<re2c::RuleOp*,bool>const,unsigned_long>>,std::less<std::pair<re2c::RuleOp*,bool>>,std::allocator<std::pair<std::pair<re2c::RuleOp*,bool>const,unsigned_long>>>
                 ::_M_emplace_unique<std::pair<std::pair<re2c::RuleOp*,bool>,unsigned_long>>
                           ((_Rb_tree<std::pair<re2c::RuleOp*,bool>,std::pair<std::pair<re2c::RuleOp*,bool>const,unsigned_long>,std::_Select1st<std::pair<std::pair<re2c::RuleOp*,bool>const,unsigned_long>>,std::less<std::pair<re2c::RuleOp*,bool>>,std::allocator<std::pair<std::pair<re2c::RuleOp*,bool>const,unsigned_long>>>
                             *)&local_60,&local_b8);
        if (((undefined1  [16])pVar32 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          pmVar14 = std::
                    map<std::pair<re2c::RuleOp_*,_bool>,_unsigned_long,_std::less<std::pair<re2c::RuleOp_*,_bool>_>,_std::allocator<std::pair<const_std::pair<re2c::RuleOp_*,_bool>,_unsigned_long>_>_>
                    ::operator[]((map<std::pair<re2c::RuleOp_*,_bool>,_unsigned_long,_std::less<std::pair<re2c::RuleOp_*,_bool>_>,_std::allocator<std::pair<const_std::pair<re2c::RuleOp_*,_bool>,_unsigned_long>_>_>
                                  *)&local_60,&local_d0);
          mVar7 = *pmVar14;
          *(mapped_type *)((long)pvVar10 + uVar30 * 8) = mVar7;
          *(undefined8 *)((long)pvVar13 + uVar30 * 8) = *(undefined8 *)((long)pvVar13 + mVar7 * 8);
          *(unsigned_long *)((long)pvVar13 + mVar7 * 8) = uVar30;
        }
        else {
          *(unsigned_long *)((long)pvVar10 + uVar30 * 8) = uVar30;
          *(undefined8 *)((long)pvVar13 + uVar30 * 8) = 0xffffffffffffffff;
        }
        uVar30 = uVar30 + 1;
      } while (uVar20 + (uVar20 == 0) != uVar30);
    }
    uVar24 = uVar20 * sVar3 * 8;
    if (0x1fffffffffffffff < uVar20 * sVar3) {
      uVar24 = 0xffffffffffffffff;
    }
    pvVar15 = operator_new__(uVar24);
    pvVar16 = operator_new__(uVar21);
    ppdVar26 = (dfa->states).
               super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    local_68 = sVar3 * 8;
    uVar24 = 0;
    uVar21 = 0;
    local_90 = ppdVar26;
    do {
      for (; uVar24 < uVar20; uVar24 = uVar24 + 1) {
        if ((uVar24 == *(ulong *)((long)pvVar10 + uVar24 * 8)) &&
           (*(long *)((long)pvVar13 + uVar24 * 8) != -1)) {
          uVar22 = uVar24;
          if (uVar24 == 0xffffffffffffffff) {
            bVar31 = false;
          }
          else {
            do {
              if (sVar3 != 0) {
                psVar8 = ppdVar26[uVar22]->arcs;
                sVar27 = 0;
                do {
                  uVar25 = 0xffffffffffffffff;
                  if (psVar8[sVar27] != 0xffffffffffffffff) {
                    uVar25 = *(undefined8 *)((long)pvVar10 + psVar8[sVar27] * 8);
                  }
                  *(undefined8 *)((long)pvVar15 + sVar27 * 8 + uVar22 * sVar3 * 8) = uVar25;
                  sVar27 = sVar27 + 1;
                } while (sVar3 != sVar27);
              }
              uVar22 = *(ulong *)((long)pvVar13 + uVar22 * 8);
            } while (uVar22 != 0xffffffffffffffff);
            uVar22 = 0;
            local_70 = uVar24;
            local_80 = uVar21;
            local_78 = uVar24;
            do {
              uVar21 = *(ulong *)((long)pvVar13 + local_70 * 8);
              local_c0 = local_70;
              if (uVar22 == 0) {
                uVar24 = 0;
                local_70 = uVar21;
LAB_001310ff:
                if (uVar24 == uVar22) goto LAB_00131104;
              }
              else {
                lVar19 = local_70 * sVar3;
                uVar24 = 0;
                local_70 = uVar21;
                do {
                  lVar18 = *(long *)((long)pvVar16 + uVar24 * 8);
                  iVar9 = bcmp((void *)((long)pvVar15 + lVar19 * 8),
                               (void *)((long)pvVar15 + lVar18 * sVar3 * 8),local_68);
                  if (iVar9 == 0) {
                    *(long *)((long)pvVar10 + local_c0 * 8) = lVar18;
                    *(undefined8 *)((long)pvVar13 + local_c0 * 8) =
                         *(undefined8 *)((long)pvVar13 + lVar18 * 8);
                    *(ulong *)((long)pvVar13 + lVar18 * 8) = local_c0;
                    goto LAB_001310ff;
                  }
                  uVar24 = uVar24 + 1;
                } while (uVar22 != uVar24);
LAB_00131104:
                *(ulong *)((long)pvVar16 + uVar22 * 8) = local_c0;
                uVar22 = uVar22 + 1;
                *(ulong *)((long)pvVar10 + local_c0 * 8) = local_c0;
                *(undefined8 *)((long)pvVar13 + local_c0 * 8) = 0xffffffffffffffff;
              }
            } while (local_70 != 0xffffffffffffffff);
            bVar31 = 1 < uVar22;
            uVar21 = local_80;
            ppdVar26 = local_90;
            uVar24 = local_78;
          }
          uVar21 = CONCAT71((int7)(uVar21 >> 8),(byte)uVar21 | bVar31);
        }
      }
      uVar24 = 0;
      uVar22 = uVar21 & 1;
      uVar21 = 0;
    } while (uVar22 != 0);
    operator_delete__(pvVar15);
    operator_delete__(pvVar16);
    operator_delete__(pvVar13);
    std::
    _Rb_tree<std::pair<re2c::RuleOp_*,_bool>,_std::pair<const_std::pair<re2c::RuleOp_*,_bool>,_unsigned_long>,_std::_Select1st<std::pair<const_std::pair<re2c::RuleOp_*,_bool>,_unsigned_long>_>,_std::less<std::pair<re2c::RuleOp_*,_bool>_>,_std::allocator<std::pair<const_std::pair<re2c::RuleOp_*,_bool>,_unsigned_long>_>_>
    ::~_Rb_tree(&local_60);
  }
  else if (poVar11->dfa_minimization == DFA_MINIMIZATION_TABLE) {
    sVar3 = dfa->nchars;
    ppdVar26 = (dfa->states).
               super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    ppdVar4 = (dfa->states).
              super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    uVar21 = (long)ppdVar4 - (long)ppdVar26 >> 3;
    uVar20 = 0xffffffffffffffff;
    if (uVar21 < 0x2000000000000000) {
      uVar20 = (long)ppdVar4 - (long)ppdVar26;
    }
    puVar12 = (undefined8 *)operator_new__(uVar20);
    lVar19 = uVar21 - 1;
    pvVar13 = operator_new__(lVar19 * uVar21 >> 1);
    *puVar12 = pvVar13;
    if (lVar19 != 0) {
      lVar18 = 0;
      do {
        pvVar13 = (void *)((long)pvVar13 + lVar18);
        puVar12[lVar18 + 1] = pvVar13;
        lVar18 = lVar18 + 1;
      } while (lVar19 != lVar18);
    }
    if (ppdVar4 != ppdVar26) {
      lVar19 = 0;
      do {
        if (lVar19 != 0) {
          pdVar5 = ppdVar26[lVar19];
          lVar18 = puVar12[lVar19];
          lVar23 = 0;
          do {
            bVar31 = true;
            if (pdVar5->ctx == ppdVar26[lVar23]->ctx) {
              bVar31 = pdVar5->rule != ppdVar26[lVar23]->rule;
            }
            *(bool *)(lVar18 + lVar23) = bVar31;
            lVar23 = lVar23 + 1;
          } while (lVar19 != lVar23);
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 != uVar21 + (uVar21 == 0));
    }
    uVar20 = 0;
    bVar31 = false;
    do {
      for (; bVar17 = bVar31, uVar20 < uVar21; uVar20 = uVar20 + 1) {
        if (uVar20 != 0) {
          lVar19 = puVar12[uVar20];
          uVar24 = 0;
          do {
            if ((sVar3 != 0) && (*(char *)(lVar19 + uVar24) == '\0')) {
              sVar27 = 0;
              do {
                uVar22 = ppdVar26[uVar20]->arcs[sVar27];
                uVar6 = ppdVar26[uVar24]->arcs[sVar27];
                uVar29 = uVar6;
                if (uVar22 >= uVar6 && uVar22 != uVar6) {
                  uVar29 = uVar22;
                }
                uVar28 = uVar6;
                if (uVar22 < uVar6) {
                  uVar28 = uVar22;
                }
                if ((uVar22 != uVar6) &&
                   (((uVar29 == 0xffffffffffffffff || (uVar28 == 0xffffffffffffffff)) ||
                    (*(char *)(puVar12[uVar29] + uVar28) == '\x01')))) {
                  *(undefined1 *)(lVar19 + uVar24) = 1;
                  bVar17 = true;
                  break;
                }
                sVar27 = sVar27 + 1;
              } while (sVar3 != sVar27);
            }
            uVar24 = uVar24 + 1;
          } while (uVar24 != uVar20);
        }
        bVar31 = bVar17;
      }
      uVar20 = 0;
      bVar31 = false;
    } while (bVar17);
    if (ppdVar4 != ppdVar26) {
      lVar19 = 0;
      do {
        *(long *)((long)pvVar10 + lVar19 * 8) = lVar19;
        if (lVar19 != 0) {
          lVar18 = 0;
          do {
            if (*(char *)(puVar12[lVar19] + lVar18) == '\0') {
              *(long *)((long)pvVar10 + lVar19 * 8) = lVar18;
              break;
            }
            lVar18 = lVar18 + 1;
          } while (lVar19 != lVar18);
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 != uVar21 + (uVar21 == 0));
    }
    if ((void *)*puVar12 != (void *)0x0) {
      operator_delete__((void *)*puVar12);
    }
    operator_delete__(puVar12);
  }
  pvVar13 = operator_new__(local_88);
  if (ppdVar2 != ppdVar1) {
    lVar19 = 0;
    lVar18 = 0;
    do {
      if (lVar19 == *(long *)((long)pvVar10 + lVar19 * 8)) {
        *(long *)((long)pvVar13 + lVar19 * 8) = lVar18;
        lVar18 = lVar18 + 1;
      }
      lVar19 = lVar19 + 1;
    } while (local_98 + (local_98 == 0) != lVar19);
    if (ppdVar2 != ppdVar1) {
      lVar19 = local_98 + (local_98 == 0);
      lVar18 = 0;
      __new_size = 0;
      do {
        ppdVar1 = (dfa->states).
                  super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pdVar5 = ppdVar1[lVar18];
        if (lVar18 == *(long *)((long)pvVar10 + lVar18 * 8)) {
          uVar20 = dfa->nchars;
          if (uVar20 != 0) {
            psVar8 = pdVar5->arcs;
            uVar21 = 0;
            do {
              sVar3 = psVar8[uVar21];
              if (sVar3 != 0xffffffffffffffff) {
                psVar8[uVar21] =
                     *(size_t *)((long)pvVar13 + *(long *)((long)pvVar10 + sVar3 * 8) * 8);
                uVar20 = dfa->nchars;
              }
              uVar21 = uVar21 + 1;
            } while (uVar21 < uVar20);
          }
          ppdVar1[__new_size] = pdVar5;
          __new_size = __new_size + 1;
        }
        else {
          if ((pdVar5 != (dfa_state_t *)0x0) && (pdVar5->arcs != (size_t *)0x0)) {
            operator_delete__(pdVar5->arcs);
          }
          operator_delete(pdVar5,0x18);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != lVar19);
      goto LAB_001312a1;
    }
  }
  __new_size = 0;
LAB_001312a1:
  std::vector<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>::resize
            (&dfa->states,__new_size);
  operator_delete__(pvVar13);
  operator_delete__(pvVar10);
  return;
}

Assistant:

void minimization(dfa_t &dfa)
{
	const size_t count = dfa.states.size();

	size_t *part = new size_t[count];

	switch (opts->dfa_minimization)
	{
		case DFA_MINIMIZATION_TABLE:
			minimization_table(part, dfa.states, dfa.nchars);
			break;
		case DFA_MINIMIZATION_MOORE:
			minimization_moore(part, dfa.states, dfa.nchars);
			break;
	}

	size_t *compact = new size_t[count];
	for (size_t i = 0, j = 0; i < count; ++i)
	{
		if (i == part[i])
		{
			compact[i] = j++;
		}
	}

	size_t new_count = 0;
	for (size_t i = 0; i < count; ++i)
	{
		dfa_state_t *s = dfa.states[i];
		if (i == part[i])
		{
			size_t *arcs = s->arcs;
			for (size_t c = 0; c < dfa.nchars; ++c)
			{
				if (arcs[c] != dfa_t::NIL)
				{
					arcs[c] = compact[part[arcs[c]]];
				}
			}
			dfa.states[new_count++] = s;
		}
		else
		{
			delete s;
		}
	}
	dfa.states.resize(new_count);

	delete[] compact;
	delete[] part;
}